

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O0

void get_set_srv(void)

{
  byte bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  io_service *piVar4;
  ostringstream oss_7;
  ostringstream oss_6;
  system_error *e_1;
  ostringstream oss_5;
  ostringstream oss_4;
  stream_socket s2;
  system_error *e;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  stream_socket s1;
  io_service srv;
  string local_6c8 [32];
  ostringstream local_6a8 [383];
  undefined1 local_529;
  string local_528 [32];
  ostringstream local_508 [383];
  undefined1 local_389;
  string local_388 [32];
  ostringstream local_368 [383];
  undefined1 local_1e9;
  string local_1e8 [32];
  ostringstream local_1c8 [392];
  stream_socket local_40 [48];
  io_service local_10 [16];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Test get/set io_service");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  booster::aio::io_service::io_service(local_10);
  booster::aio::stream_socket::stream_socket(local_40,local_10);
  bVar1 = booster::aio::basic_io_device::has_io_service();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar2 = std::operator<<((ostream *)local_1c8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x115);
    std::operator<<(poVar2," s1.has_io_service()");
    local_1e9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1e8);
    local_1e9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  piVar4 = (io_service *)booster::aio::basic_io_device::get_io_service();
  if (piVar4 == local_10) {
    booster::aio::basic_io_device::reset_io_service();
    bVar1 = booster::aio::basic_io_device::has_io_service();
    if ((bVar1 & 1) == 0) {
      booster::aio::basic_io_device::get_io_service();
      std::__cxx11::ostringstream::ostringstream(local_6a8);
      poVar2 = std::operator<<((ostream *)local_6a8,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x119);
      std::operator<<(poVar2," !\"Shoud throw\"");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_6c8);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream(local_508);
    poVar2 = std::operator<<((ostream *)local_508,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x118);
    std::operator<<(poVar2," !s1.has_io_service()");
    local_529 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_528);
    local_529 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_368);
  poVar2 = std::operator<<((ostream *)local_368,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x116);
  std::operator<<(poVar2," &s1.get_io_service() == &srv");
  local_389 = 1;
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar3,local_388);
  local_389 = 0;
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void get_set_srv()
{
	std::cout << "Test get/set io_service" << std::endl;
	io::io_service srv;
	io::stream_socket s1(srv);
	TEST(s1.has_io_service());
	TEST(&s1.get_io_service() == &srv);
	s1.reset_io_service();
	TEST(!s1.has_io_service());
	try {s1.get_io_service(); TEST(!"Shoud throw"); }
	catch(sys::system_error const &e) {}
	io::stream_socket s2;
	TEST(!s2.has_io_service());
	try {s2.get_io_service(); TEST(!"Shoud throw"); }
	catch(sys::system_error const &e) {}
	s1.set_io_service(srv);
	s2.set_io_service(srv);
	TEST(&s1.get_io_service() == &srv);
	TEST(&s2.get_io_service() == &srv);
}